

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

void miniscript::internal::BuildBack<unsigned_int>
               (MiniscriptContext script_ctx,Fragment nt,
               vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
               *constructed,bool reverse)

{
  long lVar1;
  byte bVar2;
  byte in_CL;
  long in_FS_OFFSET;
  NodeRef<unsigned_int> child;
  vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
  *in_stack_ffffffffffffff58;
  shared_ptr<const_miniscript::Node<unsigned_int>_> *in_stack_ffffffffffffff60;
  vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
  *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  shared_ptr<const_miniscript::Node<unsigned_int>_> *in_stack_ffffffffffffffa0;
  shared_ptr<const_miniscript::Node<unsigned_int>_> *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_CL & 1;
  std::
  vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
  ::back(in_stack_ffffffffffffff58);
  std::shared_ptr<const_miniscript::Node<unsigned_int>_>::shared_ptr
            ((shared_ptr<const_miniscript::Node<unsigned_int>_> *)in_stack_ffffffffffffff58,
             (shared_ptr<const_miniscript::Node<unsigned_int>_> *)0xed5d01);
  std::
  vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
  ::pop_back(in_stack_ffffffffffffff58);
  if ((bVar2 & 1) == 0) {
    std::
    vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
    ::back(in_stack_ffffffffffffff58);
    Vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::shared_ptr<miniscript::Node<unsigned_int>const>>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    MakeNodeRef<unsigned_int,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext_const&,miniscript::Fragment&,std::vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>>
              ((NoDupCheck *)CONCAT17(bVar2,in_stack_ffffffffffffff70),
               (MiniscriptContext *)in_stack_ffffffffffffff68,(Fragment *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    std::
    vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
    ::back(in_stack_ffffffffffffff58);
    std::shared_ptr<const_miniscript::Node<unsigned_int>_>::operator=
              ((shared_ptr<const_miniscript::Node<unsigned_int>_> *)in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
    std::shared_ptr<const_miniscript::Node<unsigned_int>_>::~shared_ptr
              ((shared_ptr<const_miniscript::Node<unsigned_int>_> *)in_stack_ffffffffffffff58);
    std::
    vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
    ::~vector(in_stack_ffffffffffffff68);
  }
  else {
    std::
    vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
    ::back(in_stack_ffffffffffffff58);
    Vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::shared_ptr<miniscript::Node<unsigned_int>const>>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    MakeNodeRef<unsigned_int,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext_const&,miniscript::Fragment&,std::vector<std::shared_ptr<miniscript::Node<unsigned_int>const>,std::allocator<std::shared_ptr<miniscript::Node<unsigned_int>const>>>>
              ((NoDupCheck *)CONCAT17(bVar2,in_stack_ffffffffffffff70),
               (MiniscriptContext *)in_stack_ffffffffffffff68,(Fragment *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    std::
    vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
    ::back(in_stack_ffffffffffffff58);
    std::shared_ptr<const_miniscript::Node<unsigned_int>_>::operator=
              ((shared_ptr<const_miniscript::Node<unsigned_int>_> *)in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
    std::shared_ptr<const_miniscript::Node<unsigned_int>_>::~shared_ptr
              ((shared_ptr<const_miniscript::Node<unsigned_int>_> *)in_stack_ffffffffffffff58);
    std::
    vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
    ::~vector(in_stack_ffffffffffffff68);
  }
  std::shared_ptr<const_miniscript::Node<unsigned_int>_>::~shared_ptr
            ((shared_ptr<const_miniscript::Node<unsigned_int>_> *)in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BuildBack(const MiniscriptContext script_ctx, Fragment nt, std::vector<NodeRef<Key>>& constructed, const bool reverse = false)
{
    NodeRef<Key> child = std::move(constructed.back());
    constructed.pop_back();
    if (reverse) {
        constructed.back() = MakeNodeRef<Key>(internal::NoDupCheck{}, script_ctx, nt, Vector(std::move(child), std::move(constructed.back())));
    } else {
        constructed.back() = MakeNodeRef<Key>(internal::NoDupCheck{}, script_ctx, nt, Vector(std::move(constructed.back()), std::move(child)));
    }
}